

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

bool __thiscall
absl::Mutex::LockSlowWithDeadline(Mutex *this,MuHow how,Condition *cond,KernelTimeout t,int flags)

{
  ulong uVar1;
  bool bVar2;
  uint flags_00;
  bool bVar3;
  SynchWaitParams waitp;
  SynchWaitParams local_68;
  
  uVar1 = (this->mu_).super___atomic_base<long>._M_i;
  if ((how->fast_need_zero & uVar1) == 0) {
    bVar2 = false;
    LOCK();
    bVar3 = uVar1 == (this->mu_).super___atomic_base<long>._M_i;
    if (bVar3) {
      (this->mu_).super___atomic_base<long>._M_i =
           ((-(ulong)((flags & 1U) == 0) | 0xfffffffffffffffd) & uVar1 | how->fast_or) +
           how->fast_add;
    }
    UNLOCK();
    if (bVar3) {
      if (cond == (Condition *)0x0) {
        return true;
      }
      if (cond->eval_ == (_func_bool_Condition_ptr *)0x0) {
        return true;
      }
      bVar3 = (*cond->eval_)(cond);
      bVar2 = true;
      if (bVar3) {
        return true;
      }
    }
  }
  else {
    bVar2 = false;
  }
  local_68.thread = &base_internal::CurrentThreadIdentityIfPresent()->per_thread_synch;
  if ((ThreadIdentity *)local_68.thread == (ThreadIdentity *)0x0) {
    local_68.thread = &synchronization_internal::CreateThreadIdentity()->per_thread_synch;
  }
  local_68.cvmu = (Mutex *)0x0;
  local_68.cv_word = (atomic<long> *)0x0;
  local_68.how = how;
  local_68.cond = cond;
  local_68.timeout.ns_ = t.ns_;
  if (base_internal::CycleClock::cycle_clock_source_ == (code *)0x0) {
    local_68.contention_start_cycles = rdtsc();
  }
  else {
    local_68.contention_start_cycles = (*base_internal::CycleClock::cycle_clock_source_)();
  }
  local_68.contention_start_cycles = local_68.contention_start_cycles >> 2;
  if (cond == (Condition *)0x0) {
    bVar3 = true;
  }
  else {
    bVar3 = cond->eval_ == (_func_bool_Condition_ptr *)0x0;
  }
  flags_00 = flags | 2;
  if (bVar3) {
    flags_00 = flags;
  }
  if (bVar2) {
    UnlockSlow(this,&local_68);
    Block(this,local_68.thread);
    flags_00 = flags_00 | 1;
  }
  LockSlowLoop(this,&local_68,flags_00);
  bVar2 = true;
  if (((cond != (Condition *)0x0) && (local_68.cond == (Condition *)0x0)) &&
     (cond->eval_ != (_func_bool_Condition_ptr *)0x0)) {
    bVar2 = (*cond->eval_)(cond);
  }
  return bVar2;
}

Assistant:

bool Mutex::LockSlowWithDeadline(MuHow how, const Condition *cond,
                                 KernelTimeout t, int flags) {
  intptr_t v = mu_.load(std::memory_order_relaxed);
  bool unlock = false;
  if ((v & how->fast_need_zero) == 0 &&  // try fast acquire
      mu_.compare_exchange_strong(
          v,
          (how->fast_or |
           (v & ClearDesignatedWakerMask(flags & kMuHasBlocked))) +
              how->fast_add,
          std::memory_order_acquire, std::memory_order_relaxed)) {
    if (cond == nullptr ||
        EvalConditionAnnotated(cond, this, true, false, how == kShared)) {
      return true;
    }
    unlock = true;
  }
  SynchWaitParams waitp(
      how, cond, t, nullptr /*no cvmu*/, Synch_GetPerThreadAnnotated(this),
      nullptr /*no cv_word*/);
  if (!Condition::GuaranteedEqual(cond, nullptr)) {
    flags |= kMuIsCond;
  }
  if (unlock) {
    this->UnlockSlow(&waitp);
    this->Block(waitp.thread);
    flags |= kMuHasBlocked;
  }
  this->LockSlowLoop(&waitp, flags);
  return waitp.cond != nullptr ||  // => cond known true from LockSlowLoop
         cond == nullptr ||
         EvalConditionAnnotated(cond, this, true, false, how == kShared);
}